

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::Read(ON_Linetype *this,ON_BinaryArchive *file)

{
  bool bVar1;
  LineCapStyle LVar2;
  LineJoinStyle LVar3;
  LengthUnitSystem LVar4;
  wchar_t *component_name;
  ON_UUID *pOVar5;
  ON_LinetypePrivate *pOVar6;
  byte bVar7;
  int linetype_index;
  int minor_version;
  ON_wString linetype_name;
  ON_UUID linetype_id;
  int major_version;
  uint local_58;
  int local_54;
  ON_wString local_50;
  ON_SimpleArray<ON_2dPoint> local_48;
  int local_24;
  
  operator=(this,&Unset);
  local_24 = 0;
  local_54 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_24,&local_54);
  if (!bVar1) {
    return false;
  }
  if (local_24 == 2) {
    local_50.m_s._0_4_ = 0;
    bVar1 = ON_BinaryArchive::ReadModelComponentAttributes
                      (file,&this->super_ON_ModelComponent,(uint *)&local_50);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_private->m_segments), bVar1))
    {
      local_58 = local_58 & 0xffffff00;
      if (local_54 < 1) {
LAB_004d18a5:
        if (local_54 < 2) {
LAB_004d1a1e:
          if (2 < local_54) {
            if ((byte)local_58 == '\x06') {
              local_48._vptr_ON_SimpleArray =
                   (_func_int **)((ulong)local_48._vptr_ON_SimpleArray & 0xffffffffffffff00);
              bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&local_48);
              if (bVar1) {
                this->m_private->m_always_model_distances =
                     (bool)(byte)local_48._vptr_ON_SimpleArray;
                bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
                if (bVar1) goto LAB_004d1a5c;
              }
              goto LAB_004d1ab2;
            }
LAB_004d1a5c:
            if ((local_54 == 3) && ((byte)local_58 != '\0')) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                         ,0x256,"","Bug in ON_Linetype::Read for chunk version 2.3");
            }
          }
          bVar7 = 1;
          if (6 < (byte)local_58) {
            local_58 = local_58 & 0xffffff00;
          }
          goto LAB_004d1ab5;
        }
        if ((byte)local_58 == '\x03') {
          local_48._vptr_ON_SimpleArray = (_func_int **)0x3ff0000000000000;
          bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&local_48);
          if (bVar1) {
            this->m_width = (double)local_48._vptr_ON_SimpleArray;
            bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
            if (bVar1) goto LAB_004d18fa;
          }
        }
        else {
LAB_004d18fa:
          if ((byte)local_58 == '\x04') {
            local_48._vptr_ON_SimpleArray =
                 (_func_int **)((ulong)local_48._vptr_ON_SimpleArray & 0xffffffffffffff00);
            bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_48);
            if (bVar1) {
              LVar4 = ON::LengthUnitSystemFromUnsigned((uint)(byte)local_48._vptr_ON_SimpleArray);
              this->m_width_units = LVar4;
              bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
              if (bVar1) goto LAB_004d193c;
            }
          }
          else {
LAB_004d193c:
            if ((byte)local_58 != '\x05') {
LAB_004d19f0:
              if ((local_54 == 2) && ((byte)local_58 != '\0')) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                           ,0x243,"","Bug in ON_Linetype::Read for chunk version 2.2");
              }
              goto LAB_004d1a1e;
            }
            local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
            local_48.m_a = (ON_2dPoint *)0x0;
            local_48.m_count = 0;
            local_48.m_capacity = 0;
            bVar1 = ON_BinaryArchive::ReadArray(file,&local_48);
            if (bVar1) {
              if (this->m_private == (ON_LinetypePrivate *)0x0) {
                pOVar6 = (ON_LinetypePrivate *)operator_new(0x38);
                (pOVar6->m_segments)._vptr_ON_SimpleArray = (_func_int **)0x0;
                (pOVar6->m_segments).m_a = (ON_LinetypeSegment *)0x0;
                (pOVar6->m_segments).m_count = 0;
                (pOVar6->m_segments).m_capacity = 0;
                (pOVar6->m_taper_points)._vptr_ON_SimpleArray = (_func_int **)0x0;
                (pOVar6->m_taper_points).m_a = (ON_2dPoint *)0x0;
                (pOVar6->m_taper_points).m_count = 0;
                (pOVar6->m_taper_points).m_capacity = 0;
                *(undefined8 *)&pOVar6->m_always_model_distances = 0;
                (pOVar6->m_segments)._vptr_ON_SimpleArray =
                     (_func_int **)&PTR__ON_SimpleArray_00821cf0;
                (pOVar6->m_segments).m_a = (ON_LinetypeSegment *)0x0;
                (pOVar6->m_segments).m_count = 0;
                (pOVar6->m_segments).m_capacity = 0;
                (pOVar6->m_taper_points)._vptr_ON_SimpleArray =
                     (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
                pOVar6->m_always_model_distances = false;
                this->m_private = pOVar6;
              }
              ON_SimpleArray<ON_2dPoint>::operator=(&this->m_private->m_taper_points,&local_48);
              bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
              ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_48);
              if (bVar1) goto LAB_004d19f0;
            }
            else {
              ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_48);
            }
          }
        }
      }
      else {
        bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
        if (bVar1) {
          if ((byte)local_58 == '\x01') {
            local_48._vptr_ON_SimpleArray =
                 (_func_int **)((ulong)local_48._vptr_ON_SimpleArray & 0xffffffffffffff00);
            bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_48);
            if (bVar1) {
              LVar2 = ON::LineCapStyleFromUnsigned((uint)(byte)local_48._vptr_ON_SimpleArray);
              this->m_cap_style = LVar2;
              bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
              if (bVar1) goto LAB_004d1835;
            }
          }
          else {
LAB_004d1835:
            if ((byte)local_58 != '\x02') {
LAB_004d1877:
              if ((local_54 == 1) && ((byte)local_58 != '\0')) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                           ,0x216,"","Bug in ON_Linetype::Read for chunk version 2.1");
              }
              goto LAB_004d18a5;
            }
            local_48._vptr_ON_SimpleArray =
                 (_func_int **)((ulong)local_48._vptr_ON_SimpleArray & 0xffffffffffffff00);
            bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_48);
            if (bVar1) {
              LVar3 = ON::LineJoinStyleFromUnsigned((uint)(byte)local_48._vptr_ON_SimpleArray);
              this->m_join_style = LVar3;
              bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_58);
              if (bVar1) goto LAB_004d1877;
            }
          }
        }
      }
    }
  }
  else if (local_24 == 1) {
    local_58 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_58);
    if (bVar1) {
      ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,local_58);
      ON_wString::ON_wString(&local_50);
      ON_ModelComponent::GetName(&this->super_ON_ModelComponent,&local_50);
      bVar1 = ON_BinaryArchive::ReadString(file,&local_50);
      if (bVar1) {
        component_name = ON_wString::operator_cast_to_wchar_t_(&local_50);
        ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
        bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_private->m_segments);
        if (!bVar1) goto LAB_004d1a99;
        if (0 < local_54) {
          pOVar5 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
          local_48._vptr_ON_SimpleArray = *(_func_int ***)pOVar5;
          local_48.m_a = *(ON_2dPoint **)pOVar5->Data4;
          bVar1 = ON_BinaryArchive::ReadUuid(file,(ON_UUID *)&local_48);
          if ((!bVar1) ||
             (ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)&local_48), !bVar1)
             ) goto LAB_004d1a99;
        }
        bVar7 = 1;
      }
      else {
LAB_004d1a99:
        bVar7 = 0;
      }
      ON_wString::~ON_wString(&local_50);
      goto LAB_004d1ab5;
    }
  }
LAB_004d1ab2:
  bVar7 = 0;
LAB_004d1ab5:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & bVar7);
}

Assistant:

bool ON_Linetype::Read( ON_BinaryArchive& file)
{
  *this = ON_Linetype::Unset;

  int major_version=0;
  int minor_version=0;
  if (!file.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version ))
    return false;

  bool rc = false;


  if( 1 == major_version ) 
  {
    for (;;)
    {
      // chunk version 1.0 fields
      int linetype_index = Index();
      if (!file.ReadInt(&linetype_index))
        break;
      SetIndex(linetype_index);

      ON_wString linetype_name;
      GetName(linetype_name);
      if (!file.ReadString(linetype_name))
        break;
      SetName(linetype_name);

      if (!file.ReadArray(m_private->m_segments))
        break;

      if (minor_version >= 1)
      {
        ON_UUID linetype_id = Id();
        if (!file.ReadUuid(linetype_id))
          break;
        SetId(linetype_id);
      }

      rc = true;
      break;
    }
  }
  else if ( 2 == major_version )
  {
    for (;;)
    {
      // chunk version 2.0 fields
      unsigned int model_component_attributes_filter = 0;
      if (!file.ReadModelComponentAttributes(*this,&model_component_attributes_filter))
        break;

      if (!file.ReadArray(m_private->m_segments))
        break;

      unsigned char item_id = 0;
      // 12 Aug 2021 S. Baer (RH-2285)
      // Add cap and join style to linetype
      if (minor_version >= 1)
      {
        if (!file.ReadChar(&item_id))
          break;

        if (ON_LinetypeTypeCodes::LineCap == item_id)
        {
          unsigned char cap = 0;
          if (!file.ReadChar(&cap))
            break;
          m_cap_style = ON::LineCapStyleFromUnsigned(cap);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::LineJoin == item_id)
        {
          unsigned char join = 0;
          if (!file.ReadChar(&join))
            break;
          m_join_style = ON::LineJoinStyleFromUnsigned(join);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (1 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.1");
        }
      }

      // 12 Aug 2021 S. Baer (RH-2285)
      // Add cap and join style to linetype
      if (minor_version >= 2)
      {
        if (ON_LinetypeTypeCodes::Width == item_id)
        {
          double width = 1;
          if (!file.ReadDouble(&width))
            break;
          SetWidth(width);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::WidthUnits == item_id)
        {
          unsigned char width_units = 0;
          if (!file.ReadChar(&width_units))
            break;
          SetWidthUnits(ON::LengthUnitSystemFromUnsigned(width_units));

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::Taper == item_id)
        {
          ON_SimpleArray<ON_2dPoint> taper;
          if (!file.ReadArray(taper))
            break;
          if (nullptr == m_private)
            m_private = new ON_LinetypePrivate();
          m_private->m_taper_points = taper;

          if (!file.ReadChar(&item_id))
            break;
        }

        if (2 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.2");
        }
      }

      if (minor_version >= 3)
      {
        if (ON_LinetypeTypeCodes::AlwaysModelDistance == item_id)
        {
          bool always = false;
          if (!file.ReadBool(&always))
            break;
          SetAlwaysModelDistances(always);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (3 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.3");
        }
      }

      if (item_id > ON_LinetypeTypeCodes::LastLinetypeTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 2)
        item_id = 0;
      }

      rc = true;
      break;
    }
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}